

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_portable_deserialize_frozen(char *buf)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  char *res;
  ulong uVar4;
  roaring_bitmap_t *prVar5;
  int iVar6;
  char *res_2;
  uint8_t *puVar7;
  char *pcVar8;
  int iVar9;
  char *res_1;
  int32_t *piVar10;
  ulong uVar11;
  uint uVar12;
  char *pcVar13;
  char *pcVar14;
  ushort *puVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  uint *puVar19;
  bool bVar20;
  
  uVar2 = *(uint *)buf;
  if (uVar2 == 0x303a) {
    uVar17 = (ulong)*(int *)(buf + 4);
    pcVar14 = buf + 8;
    pcVar8 = buf + uVar17 * 4 + 8;
    puVar15 = (ushort *)(pcVar8 + uVar17 * 4);
    pcVar13 = (char *)0x0;
  }
  else {
    if ((uVar2 & 0xffff) != 0x303b) {
      return (roaring_bitmap_t *)0x0;
    }
    pcVar13 = buf + 4;
    uVar12 = uVar2 >> 0x10;
    pcVar14 = pcVar13 + (uVar12 + 8 >> 3);
    uVar4 = (ulong)(uVar12 * 4 + 4);
    pcVar8 = (char *)0x0;
    if (0x2ffff < uVar2) {
      pcVar8 = pcVar14 + uVar4;
    }
    uVar17 = (ulong)(uVar12 + 1);
    uVar11 = 0;
    if (0x2ffff < uVar2) {
      uVar11 = uVar4;
    }
    puVar15 = (ushort *)(pcVar14 + uVar4 + uVar11);
  }
  uVar4 = 0;
  iVar16 = (int)uVar17;
  if (0 < iVar16) {
    uVar11 = 0;
    iVar9 = 0;
    iVar6 = 0;
    do {
      bVar20 = 0xfff < *(ushort *)(pcVar14 + uVar11 * 4 + 2);
      if (uVar2 == 0x303a) {
        bVar3 = false;
      }
      else {
        bVar20 = (1 << ((byte)uVar11 & 7) & (uint)(byte)pcVar13[uVar11 >> 3 & 0x1fffffff]) == 0;
        bVar3 = !bVar20;
        bVar20 = bVar20 && 0xfff < *(ushort *)(pcVar14 + uVar11 * 4 + 2);
      }
      if (bVar20) {
        uVar4 = (ulong)((int)uVar4 + 1);
      }
      else if (bVar3) {
        iVar9 = iVar9 + 1;
      }
      else {
        iVar6 = iVar6 + 1;
      }
      uVar11 = uVar11 + 1;
    } while ((uVar17 & 0xffffffff) != uVar11);
    uVar4 = ((long)iVar6 + (long)iVar9 + (long)(int)uVar4) * 0x10;
  }
  lVar18 = (long)iVar16;
  prVar5 = (roaring_bitmap_t *)roaring_malloc(uVar4 + lVar18 * 0xb + 0x28);
  if (prVar5 == (roaring_bitmap_t *)0x0) {
    return (roaring_bitmap_t *)0x0;
  }
  (prVar5->high_low_container).flags = '\x02';
  (prVar5->high_low_container).allocation_size = iVar16;
  (prVar5->high_low_container).size = iVar16;
  piVar10 = &prVar5[1].high_low_container.size + lVar18 * 2;
  (prVar5->high_low_container).containers = (void **)(prVar5 + 1);
  puVar7 = (uint8_t *)((long)piVar10 + lVar18 * 2);
  (prVar5->high_low_container).keys = (uint16_t *)piVar10;
  (prVar5->high_low_container).typecodes = puVar7;
  if (iVar16 < 1) {
    return prVar5;
  }
  puVar19 = (uint *)(puVar7 + lVar18);
  uVar4 = 0;
  do {
    uVar1 = *(ushort *)(pcVar14 + uVar4 * 4 + 2);
    bVar20 = 0xfff < (ulong)uVar1;
    if (uVar2 == 0x303a) {
      bVar3 = false;
    }
    else {
      bVar20 = (1 << ((byte)uVar4 & 7) & (uint)(byte)pcVar13[uVar4 >> 3 & 0x1fffffff]) == 0;
      bVar3 = !bVar20;
      bVar20 = bVar20 && 0xfff < uVar1;
    }
    lVar18 = (ulong)uVar1 + 1;
    *(undefined2 *)((long)piVar10 + uVar4 * 2) = *(undefined2 *)(pcVar14 + uVar4 * 4);
    uVar12 = (uint)lVar18;
    if (bVar20) {
      puVar7[uVar4] = '\x01';
      *puVar19 = uVar12;
      if (pcVar8 == (char *)0x0) {
        *(ushort **)(puVar19 + 2) = puVar15;
        puVar15 = puVar15 + 0x1000;
      }
      else {
LAB_001149d8:
        uVar11 = (ulong)*(uint *)(pcVar8 + uVar4 * 4);
LAB_001149e0:
        *(char **)(puVar19 + 2) = buf + uVar11;
      }
    }
    else if (bVar3) {
      puVar7[uVar4] = '\x03';
      puVar19[1] = uVar12;
      if (pcVar8 != (char *)0x0) {
        *puVar19 = (uint)*(ushort *)(buf + *(uint *)(pcVar8 + uVar4 * 4));
        uVar11 = (ulong)*(uint *)(pcVar8 + uVar4 * 4) + 2;
        goto LAB_001149e0;
      }
      uVar1 = *puVar15;
      *puVar19 = (uint)uVar1;
      *(ushort **)(puVar19 + 2) = puVar15 + 1;
      puVar15 = puVar15 + (ulong)uVar1 * 2 + 1;
    }
    else {
      puVar7[uVar4] = '\x02';
      *puVar19 = uVar12;
      puVar19[1] = uVar12;
      if (pcVar8 != (char *)0x0) goto LAB_001149d8;
      *(ushort **)(puVar19 + 2) = puVar15;
      puVar15 = puVar15 + lVar18;
    }
    (prVar5->high_low_container).containers[uVar4] = puVar19;
    puVar19 = puVar19 + 4;
    uVar4 = uVar4 + 1;
    if ((uVar17 & 0xffffffff) == uVar4) {
      return prVar5;
    }
  } while( true );
}

Assistant:

ALLOW_UNALIGNED
roaring_bitmap_t *roaring_bitmap_portable_deserialize_frozen(const char *buf) {
    char *start_of_buf = (char *)buf;
    uint32_t cookie;
    int32_t num_containers;
    uint16_t *descriptive_headers;
    uint32_t *offset_headers = NULL;
    const char *run_flag_bitset = NULL;
    bool hasrun = false;

    // deserialize cookie
    memcpy(&cookie, buf, sizeof(uint32_t));
    buf += sizeof(uint32_t);
    if (cookie == SERIAL_COOKIE_NO_RUNCONTAINER) {
        memcpy(&num_containers, buf, sizeof(int32_t));
        buf += sizeof(int32_t);
        descriptive_headers = (uint16_t *)buf;
        buf += num_containers * 2 * sizeof(uint16_t);
        offset_headers = (uint32_t *)buf;
        buf += num_containers * sizeof(uint32_t);
    } else if ((cookie & 0xFFFF) == SERIAL_COOKIE) {
        num_containers = (cookie >> 16) + 1;
        hasrun = true;
        int32_t run_flag_bitset_size = (num_containers + 7) / 8;
        run_flag_bitset = buf;
        buf += run_flag_bitset_size;
        descriptive_headers = (uint16_t *)buf;
        buf += num_containers * 2 * sizeof(uint16_t);
        if (num_containers >= NO_OFFSET_THRESHOLD) {
            offset_headers = (uint32_t *)buf;
            buf += num_containers * sizeof(uint32_t);
        }
    } else {
        return NULL;
    }

    // calculate total size for allocation
    int32_t num_bitset_containers = 0;
    int32_t num_run_containers = 0;
    int32_t num_array_containers = 0;

    for (int32_t i = 0; i < num_containers; i++) {
        uint16_t tmp;
        memcpy(&tmp, descriptive_headers + 2 * i + 1, sizeof(tmp));
        uint32_t cardinality = tmp + 1;
        bool isbitmap = (cardinality > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if (hasrun) {
            if ((run_flag_bitset[i / 8] & (1 << (i % 8))) != 0) {
                isbitmap = false;
                isrun = true;
            }
        }

        if (isbitmap) {
            num_bitset_containers++;
        } else if (isrun) {
            num_run_containers++;
        } else {
            num_array_containers++;
        }
    }

    size_t alloc_size = 0;
    alloc_size += sizeof(roaring_bitmap_t);
    alloc_size += num_containers * sizeof(container_t *);
    alloc_size += num_bitset_containers * sizeof(bitset_container_t);
    alloc_size += num_run_containers * sizeof(run_container_t);
    alloc_size += num_array_containers * sizeof(array_container_t);
    alloc_size += num_containers * sizeof(uint16_t);  // keys
    alloc_size += num_containers * sizeof(uint8_t);   // typecodes

    // allocate bitmap and construct containers
    char *arena = (char *)roaring_malloc(alloc_size);
    if (arena == NULL) {
        return NULL;
    }

    roaring_bitmap_t *rb =
        (roaring_bitmap_t *)arena_alloc(&arena, sizeof(roaring_bitmap_t));
    rb->high_low_container.flags = ROARING_FLAG_FROZEN;
    rb->high_low_container.allocation_size = num_containers;
    rb->high_low_container.size = num_containers;
    rb->high_low_container.containers = (container_t **)arena_alloc(
        &arena, sizeof(container_t *) * num_containers);

    uint16_t *keys =
        (uint16_t *)arena_alloc(&arena, num_containers * sizeof(uint16_t));
    uint8_t *typecodes =
        (uint8_t *)arena_alloc(&arena, num_containers * sizeof(uint8_t));

    rb->high_low_container.keys = keys;
    rb->high_low_container.typecodes = typecodes;

    for (int32_t i = 0; i < num_containers; i++) {
        uint16_t tmp;
        memcpy(&tmp, descriptive_headers + 2 * i + 1, sizeof(tmp));
        int32_t cardinality = tmp + 1;
        bool isbitmap = (cardinality > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if (hasrun) {
            if ((run_flag_bitset[i / 8] & (1 << (i % 8))) != 0) {
                isbitmap = false;
                isrun = true;
            }
        }

        keys[i] = descriptive_headers[2 * i];

        if (isbitmap) {
            typecodes[i] = BITSET_CONTAINER_TYPE;
            bitset_container_t *c = (bitset_container_t *)arena_alloc(
                &arena, sizeof(bitset_container_t));
            c->cardinality = cardinality;
            if (offset_headers != NULL) {
                c->words = (uint64_t *)(start_of_buf + offset_headers[i]);
            } else {
                c->words = (uint64_t *)buf;
                buf += BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
            }
            rb->high_low_container.containers[i] = c;
        } else if (isrun) {
            typecodes[i] = RUN_CONTAINER_TYPE;
            run_container_t *c =
                (run_container_t *)arena_alloc(&arena, sizeof(run_container_t));
            c->capacity = cardinality;
            uint16_t n_runs;
            if (offset_headers != NULL) {
                memcpy(&n_runs, start_of_buf + offset_headers[i],
                       sizeof(uint16_t));
                c->n_runs = n_runs;
                c->runs = (rle16_t *)(start_of_buf + offset_headers[i] +
                                      sizeof(uint16_t));
            } else {
                memcpy(&n_runs, buf, sizeof(uint16_t));
                c->n_runs = n_runs;
                buf += sizeof(uint16_t);
                c->runs = (rle16_t *)buf;
                buf += c->n_runs * sizeof(rle16_t);
            }
            rb->high_low_container.containers[i] = c;
        } else {
            typecodes[i] = ARRAY_CONTAINER_TYPE;
            array_container_t *c = (array_container_t *)arena_alloc(
                &arena, sizeof(array_container_t));
            c->cardinality = cardinality;
            c->capacity = cardinality;
            if (offset_headers != NULL) {
                c->array = (uint16_t *)(start_of_buf + offset_headers[i]);
            } else {
                c->array = (uint16_t *)buf;
                buf += cardinality * sizeof(uint16_t);
            }
            rb->high_low_container.containers[i] = c;
        }
    }

    return rb;
}